

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O1

string * Image::suffix(string *__return_storage_ptr__,string *filename)

{
  int iVar1;
  
  iVar1 = std::__cxx11::string::rfind((char *)filename,0x15974b,0xffffffffffffffff);
  if (iVar1 == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)filename);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string suffix(const std::string& filename)
	{
		int dotpos = filename.rfind(".");
		if (dotpos == std::string::npos) {
			return "";
		}
		return filename.substr(dotpos+1);
	}